

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O1

sexp_conflict
sexp_get_terminal_attributes_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  sexp psVar1;
  int iVar2;
  sexp_conflict psVar3;
  termios *__termios_p;
  sexp_conflict res1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_40 = (sexp_conflict)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  if (((ulong)arg0 & 3) == 0) {
    if (2 < arg0->tag - 0x10) goto LAB_001023ee;
  }
  else if (((ulong)arg0 & 1) == 0) {
LAB_001023ee:
    psVar3 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a port or file descriptor",arg0);
    return psVar3;
  }
  local_38.var = &local_40;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  __termios_p = (termios *)calloc(1,0x3d);
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag - 0x10 < 2) {
      psVar1 = (arg0->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        psVar1 = (arg0->value).type.slots;
        iVar2 = -1;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
          iVar2 = (int)(psVar1->value).fileno.fd;
        }
      }
      else {
        iVar2 = fileno((FILE *)psVar1);
      }
      goto LAB_00102453;
    }
    if (arg0->tag == 0x12) {
      iVar2 = (int)(arg0->value).fileno.fd;
      goto LAB_00102453;
    }
  }
  iVar2 = (int)((long)arg0 >> 1);
LAB_00102453:
  iVar2 = tcgetattr(iVar2,__termios_p);
  psVar3 = (sexp_conflict)0x3e;
  if (iVar2 == 0) {
    psVar3 = (sexp_conflict)
             sexp_make_cpointer(ctx,(long)(self->value).type.print >> 1,__termios_p,0x3e,1);
  }
  (ctx->value).context.saves = local_38.next;
  return psVar3;
}

Assistant:

sexp sexp_get_terminal_attributes_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  struct termios* tmp1;
  sexp res;
  sexp_gc_var1(res1);
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  sexp_gc_preserve1(ctx, res1);
  tmp1 = (struct termios*) calloc(1, 1 + sizeof(tmp1[0]));
  err = tcgetattr((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), tmp1);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, SEXP_FALSE, 1);
  res = res1;
  }
  sexp_gc_release1(ctx);
  return res;
}